

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puts.c
# Opt level: O3

int puts(char *__s)

{
  char **ppcVar1;
  unsigned_long uVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  
  mtx_lock(&stdout->mtx);
  iVar4 = _PDCLIB_prepwrite(stdout);
  if (iVar4 == -1) {
LAB_001091b7:
    iVar4 = -1;
  }
  else {
    cVar3 = *__s;
    if (cVar3 != '\0') {
      pcVar5 = __s + 1;
      do {
        ppcVar1 = &stdout->buffer;
        uVar2 = stdout->bufidx;
        stdout->bufidx = uVar2 + 1;
        (*ppcVar1)[uVar2] = cVar3;
        if ((stdout->bufidx == stdout->bufsize) &&
           (iVar4 = _PDCLIB_flushbuffer(stdout), iVar4 == -1)) goto LAB_001091b7;
        cVar3 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar3 != '\0');
    }
    ppcVar1 = &stdout->buffer;
    uVar2 = stdout->bufidx;
    stdout->bufidx = uVar2 + 1;
    (*ppcVar1)[uVar2] = '\n';
    if ((stdout->bufidx == stdout->bufsize) || ((stdout->status & 6) != 0)) {
      iVar4 = _PDCLIB_flushbuffer(stdout);
    }
    else {
      iVar4 = 0;
    }
  }
  mtx_unlock(&stdout->mtx);
  return iVar4;
}

Assistant:

int puts( const char * s )
{
    _PDCLIB_LOCK( stdout->mtx );

    if ( _PDCLIB_prepwrite( stdout ) == EOF )
    {
        _PDCLIB_UNLOCK( stdout->mtx );
        return EOF;
    }

    while ( *s != '\0' )
    {
        stdout->buffer[ stdout->bufidx++ ] = *s++;

        if ( stdout->bufidx == stdout->bufsize )
        {
            if ( _PDCLIB_flushbuffer( stdout ) == EOF )
            {
                _PDCLIB_UNLOCK( stdout->mtx );
                return EOF;
            }
        }
    }

    stdout->buffer[ stdout->bufidx++ ] = '\n';

    if ( ( stdout->bufidx == stdout->bufsize ) ||
         ( stdout->status & ( _IOLBF | _IONBF ) ) )
    {
        int rc = _PDCLIB_flushbuffer( stdout );
        _PDCLIB_UNLOCK( stdout->mtx );
        return rc;
    }
    else
    {
        _PDCLIB_UNLOCK( stdout->mtx );
        return 0;
    }
}